

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O3

void free_mem_pool(mem_pool *mem_pool)

{
  mem_pool *pmVar1;
  mem_pool *pmVar2;
  
  pmVar2 = mem_pool->next;
  while (pmVar2 != (mem_pool *)0x0) {
    pmVar1 = pmVar2->next;
    free(pmVar2);
    pmVar2 = pmVar1;
  }
  pmVar2 = mem_pool->prev;
  while (pmVar2 != (mem_pool *)0x0) {
    pmVar1 = pmVar2->prev;
    free(pmVar2);
    pmVar2 = pmVar1;
  }
  free(mem_pool);
  return;
}

Assistant:

void free_mem_pool(struct mem_pool* mem_pool) {
    struct mem_pool* cur = mem_pool->next;
    while (cur) {
        struct mem_pool* next = cur->next;
        free(cur);
        cur = next;
    }
    cur = mem_pool->prev;
    while (cur) {
        struct mem_pool* prev = cur->prev;
        free(cur);
        cur = prev;
    }
    free(mem_pool);
}